

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool http_TE_has_token(char *fvalue,char *token)

{
  int iVar1;
  bool bVar2;
  undefined1 local_40 [8];
  Curl_str qw;
  Curl_str name;
  char *token_local;
  char *fvalue_local;
  
  token_local = fvalue;
  while( true ) {
    if (*token_local == '\0') {
      return false;
    }
    while( true ) {
      bVar2 = true;
      if ((*token_local != ' ') && (bVar2 = true, *token_local != '\t')) {
        bVar2 = *token_local == ',';
      }
      if (!bVar2) break;
      token_local = token_local + 1;
    }
    iVar1 = Curl_str_cspn(&token_local,(Curl_str *)&qw.len," \t\r;,");
    if (iVar1 != 0) break;
    iVar1 = Curl_str_casecompare((Curl_str *)&qw.len,token);
    if (iVar1 != 0) {
      return true;
    }
    while( true ) {
      bVar2 = false;
      if (*token_local != '\0') {
        bVar2 = *token_local != ',';
      }
      if (!bVar2) break;
      if (*token_local == '\"') {
        iVar1 = Curl_str_quotedword(&token_local,(Curl_str *)local_40,0x19000);
        if (iVar1 != 0) {
          return false;
        }
      }
      else {
        token_local = token_local + 1;
      }
    }
  }
  return false;
}

Assistant:

static bool http_TE_has_token(const char *fvalue, const char *token)
{
  while(*fvalue) {
    struct Curl_str name;

    /* skip to first token */
    while(ISBLANK(*fvalue) || *fvalue == ',')
      fvalue++;
    if(Curl_str_cspn(&fvalue, &name, " \t\r;,"))
      return FALSE;
    if(Curl_str_casecompare(&name, token))
      return TRUE;

    /* skip any remainder after token, e.g. parameters with quoted strings */
    while(*fvalue && *fvalue != ',') {
      if(*fvalue == '"') {
        struct Curl_str qw;
        /* if we do not cleanly find a quoted word here, the header value
         * does not follow HTTP syntax and we reject */
        if(Curl_str_quotedword(&fvalue, &qw, CURL_MAX_HTTP_HEADER))
          return FALSE;
      }
      else
        fvalue++;
    }
  }
  return FALSE;
}